

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O3

void __thiscall
bioparser::test::BioparserFastaTest_ParseWholeWithoutTrimming_Test::
~BioparserFastaTest_ParseWholeWithoutTrimming_Test
          (BioparserFastaTest_ParseWholeWithoutTrimming_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  
  (this->super_BioparserFastaTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserFastaTest_00157ca8;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&(this->super_BioparserFastaTest).s);
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  if (pPVar1 != (Parser<biosoup::Sequence> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
  }
  (this->super_BioparserFastaTest).p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl =
       (Parser<biosoup::Sequence> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseWholeWithoutTrimming) {
  Setup("sample.fasta");
  s = p->Parse(-1, false);
  Check(false);
}